

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeRgba2.cpp
# Opt level: O2

void writeRgba2(char *fileName,Rgba *pixels,int width,int height,Box2i *dataWindow)

{
  undefined8 uVar1;
  RgbaOutputFile file;
  undefined8 local_48;
  Box2i displayWindow;
  
  displayWindow.min.x = 0;
  displayWindow.min.y = 0;
  displayWindow.max.x = width + -1;
  displayWindow.max.y = height + -1;
  local_48 = 0;
  uVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,0x3f800000,(Rgba *)&file,fileName,&displayWindow,
             dataWindow,0xf,&local_48,0,4,uVar1);
  Imf_3_4::RgbaOutputFile::setFrameBuffer((Rgba *)&file,(ulong)pixels,1);
  Imf_3_4::RgbaOutputFile::writePixels((int)&file);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&file);
  return;
}

Assistant:

void
writeRgba2 (
    const char   fileName[],
    const Rgba*  pixels,
    int          width,
    int          height,
    const Box2i& dataWindow)
{
    Box2i          displayWindow (V2i (0, 0), V2i (width - 1, height - 1));
    RgbaOutputFile file (fileName, displayWindow, dataWindow, WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, width);
    file.writePixels (dataWindow.max.y - dataWindow.min.y + 1);
}